

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O1

void __thiscall optimization::livevar_analyse::Block_Live_Var::update(Block_Live_Var *this,int idx)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer psVar3;
  pointer puVar4;
  long lVar5;
  int iVar6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  ulong uVar9;
  sharedPtrVariableSet tmp;
  VarId defvar;
  VariableSet defvars;
  VariableSet diff_result;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> useVars;
  element_type *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  VarId local_c0;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_b0;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_80;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_50;
  
  if (-1 < idx) {
    local_d0 = (this->live_vars_out).
               super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c8._M_pi =
         (this->live_vars_out).
         super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
      }
    }
    psVar3 = (this->instLiveVars).
             super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(idx + 1) <
        (ulong)((long)(this->instLiveVars).
                      super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4)) {
      psVar3 = psVar3 + (idx + 1);
      local_d0 = (psVar3->
                 super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_c8,
                 &(psVar3->
                  super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
    }
    uVar9 = (ulong)(uint)idx;
    (**(code **)(*(long *)(this->block->inst).
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t + 0x10))(&local_50);
    local_c0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    local_c0.id = *(uint32_t *)
                   ((long)(this->block->inst).
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t + 0x10);
    p_Var1 = &local_b0._M_impl.super__Rb_tree_header;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    pmVar7 = std::
             map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
             ::operator[](this->vartable,&local_c0.id);
    iVar6 = (*(((pmVar7->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_Displayable)._vptr_Displayable[1])();
    if (iVar6 != 1) {
      iVar6 = (**(code **)(*(long *)(this->block->inst).
                                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    ._M_t + 8))();
      if (iVar6 != 4) {
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>
                  ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                    *)&local_b0,&local_c0);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>
                  ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                    *)(this->defvars).
                      super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&local_c0);
      }
    }
    if (this->strict == true) {
      puVar4 = (this->block->inst).
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->block->inst).
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3) <= uVar9) {
        uVar8 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar9);
        if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
        }
        _Unwind_Resume(uVar8);
      }
      iVar6 = (**(code **)(*(long *)puVar4[uVar9]._M_t.
                                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    ._M_t + 8))();
      if (iVar6 == 7) {
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::clear(&local_50);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::clear(&local_b0);
      }
    }
    p_Var2 = &local_80._M_impl.super__Rb_tree_header;
    local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::clear(&((this->instLiveVars).
              super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9].
              super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_t);
    std::
    __set_difference<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((local_d0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
               &(local_d0->_M_t)._M_impl.super__Rb_tree_header,
               local_b0._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,&local_80,
               local_80._M_impl.super__Rb_tree_header._M_header._M_left);
    lVar5 = (long)(this->instLiveVars).
                  super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9].
                  super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
    std::
    __set_union<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_50._M_impl.super__Rb_tree_header._M_header._M_left,
               &local_50._M_impl.super__Rb_tree_header,
               local_80._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,lVar5,
               *(undefined8 *)(lVar5 + 0x18));
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_80);
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_b0);
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_50);
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
  }
  return;
}

Assistant:

void update(int idx) {
    if (idx < 0) {
      return;
    }
    auto tmp = live_vars_out;
    if (idx + 1 < instLiveVars.size()) {
      tmp = instLiveVars[idx + 1];
    }
    int size_before = instLiveVars[idx]->size();
    auto useVars = block.inst[idx]->useVars();
    auto defvar = block.inst[idx]->dest;
    // if (ignore_global_and_array) {
    //   useVars = filter_vars(useVars, vartable);
    // }
    VariableSet defvars;
    if (vartable[defvar.id].ty->kind() != mir::types::TyKind::Void &&
        block.inst[idx]->inst_kind() != mir::inst::InstKind::Store) {
      defvars.insert(defvar);
      this->defvars->insert(defvar);
    }
    if (strict) {
      if (block.inst.at(idx)->inst_kind() == mir::inst::InstKind::Phi) {
        // for (auto iter = useVars.begin(); iter != useVars.end(); iter++) {
        //   if (this->defvars->count(*iter)) {
        //     useVars.erase(iter);
        //     break;
        //   }
        // }
        useVars.clear();
        defvars.clear();
      }
    }

    VariableSet diff_result;
    instLiveVars[idx]->clear();
    std::set_difference(tmp->begin(), tmp->end(), defvars.begin(),
                        defvars.end(),
                        std::inserter(diff_result, diff_result.begin()));
    std::set_union(
        useVars.begin(), useVars.end(), diff_result.begin(), diff_result.end(),
        std::inserter(*instLiveVars[idx], instLiveVars[idx]->begin()));
  }